

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O3

void __thiscall vkt::TestCaseExecutor::TestCaseExecutor(TestCaseExecutor *this,TestContext *testCtx)

{
  _Rb_tree_header *p_Var1;
  Context *this_00;
  Archive *archive;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Library *pLVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  InstanceInterface *vki;
  VkInstance instance;
  DebugReportRecorder *this_01;
  NotSupportedError *this_02;
  string local_50;
  
  (this->super_TestCaseExecutor)._vptr_TestCaseExecutor =
       (_func_int **)&PTR__TestCaseExecutor_00d20180;
  p_Var1 = &(this->m_progCollection).m_programs._M_t._M_impl.super__Rb_tree_header;
  (this->m_progCollection).m_programs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->m_progCollection).m_programs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_progCollection).m_programs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_progCollection).m_programs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_progCollection).m_programs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  archive = testCtx->m_curArchive;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"vulkan/prebuilt","");
  ::vk::BinaryRegistryDetail::BinaryRegistryReader::BinaryRegistryReader
            (&this->m_prebuiltBinRegistry,archive,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (*testCtx->m_platform->_vptr_Platform[5])();
  pLVar4 = (Library *)
           (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
                     ((undefined8 *)CONCAT44(extraout_var,iVar3));
  (this->m_library).super_UniqueBase<vk::Library,_de::DefaultDeleter<vk::Library>_>.m_data.ptr =
       pLVar4;
  iVar3 = (*pLVar4->_vptr_Library[2])(pLVar4);
  this_00 = &this->m_context;
  Context::Context(this_00,testCtx,(PlatformInterface *)CONCAT44(extraout_var_00,iVar3),
                   &this->m_progCollection);
  bVar2 = tcu::CommandLine::isValidationEnabled(testCtx->m_cmdLine);
  if (bVar2) {
    iVar3 = (*((this->m_library).super_UniqueBase<vk::Library,_de::DefaultDeleter<vk::Library>_>.
               m_data.ptr)->_vptr_Library[2])();
    vki = Context::getInstanceInterface(this_00);
    instance = Context::getInstance(this_00);
    bVar2 = ::vk::isDebugReportSupported((PlatformInterface *)CONCAT44(extraout_var_01,iVar3));
    if (!bVar2) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"VK_EXT_debug_report is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktTestPackage.cpp"
                 ,0x9e);
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = (DebugReportRecorder *)operator_new(0x40);
    ::vk::DebugReportRecorder::DebugReportRecorder(this_01,vki,instance);
  }
  else {
    this_01 = (DebugReportRecorder *)0x0;
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  (this->m_debugReportRecorder).
  super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>.m_data.ptr
       = this_01;
  de::details::UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>::
  reset((UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_> *)
        &local_50);
  this->m_instance = (TestInstance *)0x0;
  return;
}

Assistant:

TestCaseExecutor::TestCaseExecutor (tcu::TestContext& testCtx)
	: m_prebuiltBinRegistry	(testCtx.getArchive(), "vulkan/prebuilt")
	, m_library				(createLibrary(testCtx))
	, m_context				(testCtx, m_library->getPlatformInterface(), m_progCollection)
	, m_debugReportRecorder	(testCtx.getCommandLine().isValidationEnabled()
							 ? createDebugReportRecorder(m_library->getPlatformInterface(),
														 m_context.getInstanceInterface(),
														 m_context.getInstance())
							 : MovePtr<vk::DebugReportRecorder>(DE_NULL))
	, m_instance			(DE_NULL)
{
}